

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Storage<long,_true> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ProcessorInstance *pPVar4;
  mapped_type *pmVar5;
  key_type local_20;
  
  pPVar4 = PoolAllocator::allocate<soul::heart::ProcessorInstance,soul::CodeLocation_const&>
                     (&this->newModule->allocator->pool,(CodeLocation *)(__fn + 8));
  local_20.object = (ProcessorInstance *)__fn;
  pmVar5 = std::__detail::
           _Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->processorInstanceMappings,&local_20);
  if (pmVar5->object == (ProcessorInstance *)0x0) {
    pmVar5->object = pPVar4;
    std::__cxx11::string::_M_assign((string *)&pPVar4->instanceName);
    std::__cxx11::string::_M_assign((string *)&pPVar4->sourceName);
    _Var1 = *(_Storage<long,_true> *)(__fn + 0x70);
    uVar2 = *(undefined8 *)(__fn + 0x78);
    uVar3 = *(undefined8 *)(__fn + 0x88);
    (pPVar4->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload = *(_Storage<long,_true> *)(__fn + 0x80);
    *(undefined8 *)
     &(pPVar4->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = uVar3;
    (pPVar4->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload = _Var1;
    *(undefined8 *)
     &(pPVar4->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = uVar2;
    pPVar4->arraySize = *(uint32_t *)(__fn + 0x58);
    return (int)pPVar4;
  }
  throwInternalCompilerError("mapping == nullptr","clone",0xe8);
}

Assistant:

heart::ProcessorInstance& clone (const heart::ProcessorInstance& old)
    {
        auto& p = newModule.allocate<heart::ProcessorInstance> (old.location);
        auto& mapping = processorInstanceMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        mapping = p;
        p.instanceName = old.instanceName;
        p.sourceName = old.sourceName;
        p.clockMultiplier = old.clockMultiplier;
        p.arraySize = old.arraySize;
        return p;
    }